

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
HdlcSimulationDataGenerator::CrcDivision
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *genPoly,U32 crcNumber)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  ulong uVar7;
  bool local_c9;
  DataBuilder local_9d;
  uint local_9c;
  DataBuilder local_98 [4];
  U32 i;
  DataBuilder dbyte;
  U64 byteValue;
  byte local_7e;
  U32 s;
  U8 offset;
  BitState polyBit;
  BitState bit;
  U32 bitIndex;
  uint uStack_68;
  bool zeroBits;
  U32 dataLimit;
  U32 dataIndex;
  undefined1 local_58 [8];
  vector<BitState,_std::allocator<BitState>_> polyBits;
  vector<BitState,_std::allocator<BitState>_> dataBits;
  U32 crcNumber_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *genPoly_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *crcRet;
  
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(stream);
  BytesVectorToBitsVector
            ((vector<BitState,_std::allocator<BitState>_> *)
             &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,stream,(int)sVar4 << 3);
  BytesVectorToBitsVector
            ((vector<BitState,_std::allocator<BitState>_> *)local_58,genPoly,crcNumber + 1);
  uStack_68 = 0;
  sVar4 = std::vector<BitState,_std::allocator<BitState>_>::size
                    ((vector<BitState,_std::allocator<BitState>_> *)
                     &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::vector<BitState,_std::allocator<BitState>_>::size
                    ((vector<BitState,_std::allocator<BitState>_> *)local_58);
  uVar3 = (int)sVar4 - ((int)sVar5 + -1);
  for (; uStack_68 < uVar3; uStack_68 = uStack_68 + 1) {
    local_c9 = true;
    while (local_c9) {
      pvVar6 = std::vector<BitState,_std::allocator<BitState>_>::at
                         ((vector<BitState,_std::allocator<BitState>_> *)
                          &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uStack_68);
      local_c9 = *pvVar6 == BIT_LOW && uStack_68 < uVar3;
      if (*pvVar6 == BIT_LOW && uStack_68 < uVar3) {
        uStack_68 = uStack_68 + 1;
      }
    }
    if (uStack_68 < uVar3) {
      for (polyBit = BIT_LOW;
          sVar4 = std::vector<BitState,_std::allocator<BitState>_>::size
                            ((vector<BitState,_std::allocator<BitState>_> *)local_58),
          polyBit < sVar4; polyBit = polyBit + BIT_HIGH) {
        pvVar6 = std::vector<BitState,_std::allocator<BitState>_>::at
                           ((vector<BitState,_std::allocator<BitState>_> *)
                            &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ulong)(uStack_68 + polyBit));
        vVar1 = *pvVar6;
        pvVar6 = std::vector<BitState,_std::allocator<BitState>_>::at
                           ((vector<BitState,_std::allocator<BitState>_> *)local_58,(ulong)polyBit);
        vVar2 = *pvVar6;
        pvVar6 = std::vector<BitState,_std::allocator<BitState>_>::operator[]
                           ((vector<BitState,_std::allocator<BitState>_> *)
                            &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ulong)(uStack_68 + polyBit));
        *pvVar6 = vVar1 ^ vVar2;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  local_7e = (byte)crcNumber;
  for (byteValue._4_4_ = 0; byteValue._4_4_ < crcNumber >> 3; byteValue._4_4_ = byteValue._4_4_ + 1)
  {
    _dbyte = 0;
    DataBuilder::DataBuilder(local_98);
    DataBuilder::Reset((ulonglong *)local_98,(ShiftOrder)&dbyte,0);
    sVar4 = std::vector<BitState,_std::allocator<BitState>_>::size
                      ((vector<BitState,_std::allocator<BitState>_> *)
                       &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    for (local_9c = (int)sVar4 - (uint)local_7e; uVar7 = (ulong)local_9c,
        sVar4 = std::vector<BitState,_std::allocator<BitState>_>::size
                          ((vector<BitState,_std::allocator<BitState>_> *)
                           &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage),
        uVar7 < (sVar4 - local_7e) + 8; local_9c = local_9c + 1) {
      std::vector<BitState,_std::allocator<BitState>_>::at
                ((vector<BitState,_std::allocator<BitState>_> *)
                 &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_9c);
      DataBuilder::AddBit((BitState)local_98);
    }
    local_7e = local_7e - 8;
    local_9d = dbyte;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,(value_type *)&local_9d);
    DataBuilder::~DataBuilder(local_98);
  }
  std::vector<BitState,_std::allocator<BitState>_>::~vector
            ((vector<BitState,_std::allocator<BitState>_> *)local_58);
  std::vector<BitState,_std::allocator<BitState>_>::~vector
            ((vector<BitState,_std::allocator<BitState>_> *)
             &polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::CrcDivision( const vector<U8>& stream, const vector<U8>& genPoly, U32 crcNumber )
{
    vector<BitState> dataBits = BytesVectorToBitsVector( stream, stream.size() * 8 );
    vector<BitState> polyBits = BytesVectorToBitsVector( genPoly, crcNumber + 1 );

    U32 dataIndex = 0;
    U32 dataLimit = dataBits.size() - ( polyBits.size() - 1 );
    while( dataIndex < dataLimit )
    {
        // Advance one-position or 0-bits
        bool zeroBits = true;
        while( zeroBits )
        {
            zeroBits = ( ( dataBits.at( dataIndex ) == BIT_LOW ) && ( dataIndex < dataLimit ) );
            if( zeroBits )
            {
                dataIndex++;
            }
        }

        if( dataIndex < dataLimit )
        {
            for( U32 bitIndex = 0; bitIndex < polyBits.size(); ++bitIndex )
            {
                BitState bit = dataBits.at( dataIndex + bitIndex );
                BitState polyBit = polyBits.at( bitIndex );

                dataBits[ dataIndex + bitIndex ] = BitState( bit ^ polyBit );
            }
        }

        dataIndex++;
    }

    // put the crc result in the vector of bytes
    vector<U8> crcRet;
    U8 offset = crcNumber;
    for( U32 s = 0; s < crcNumber / 8; ++s )
    {
        U64 byteValue = 0;
        DataBuilder dbyte;
        dbyte.Reset( &byteValue, AnalyzerEnums::MsbFirst, 8 );
        for( U32 i = dataBits.size() - offset; i < dataBits.size() - offset + 8; ++i )
        {
            dbyte.AddBit( dataBits.at( i ) );
        }
        offset -= 8;
        crcRet.push_back( byteValue );
    }

    return crcRet;
}